

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-client.c
# Opt level: O3

void ssh2channel_request_pty(SshChannel *sc,_Bool want_reply,Conf *conf,int w,int h)

{
  BinarySink *bs;
  SshChannelVtable *pSVar1;
  PktOut *pPVar2;
  char *str;
  strbuf *buf;
  long lVar3;
  cr_handler_fn_t handler;
  undefined7 in_register_00000031;
  ssh_ttymodes *psVar4;
  undefined8 *puVar5;
  byte bVar6;
  undefined8 auStack_a68 [161];
  uint local_560;
  Conf *local_550;
  SshChannelVtable *local_548;
  ssh_ttymodes local_540;
  
  bVar6 = 0;
  local_548 = sc[-0xb].vt;
  handler = ssh2_channel_response;
  if ((int)CONCAT71(in_register_00000031,want_reply) == 0) {
    handler = (cr_handler_fn_t)0x0;
  }
  local_550 = conf;
  pPVar2 = ssh2_chanreq_init((ssh2_channel *)(sc + -0xb),"pty-req",handler,(void *)0x0);
  bs = pPVar2->binarysink_;
  str = conf_get_str(conf,0x35);
  BinarySink_put_stringz(bs,str);
  BinarySink_put_uint32(bs,(long)w);
  BinarySink_put_uint32(bs,(long)h);
  BinarySink_put_uint32(bs,0);
  BinarySink_put_uint32(bs,0);
  buf = strbuf_new();
  pSVar1 = local_548;
  get_ttymodes_from_conf(&local_540,(Seat *)local_548[1].send_serial_break,local_550);
  psVar4 = &local_540;
  puVar5 = auStack_a68;
  for (lVar3 = 0xa1; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *(undefined8 *)psVar4->have_mode;
    psVar4 = (ssh_ttymodes *)((long)psVar4 + (ulong)bVar6 * -0x10 + 8);
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  local_560 = local_540.mode_val[0x101];
  write_ttymodes_to_packet(buf->binarysink_,2);
  BinarySink_put_stringsb(bs,buf);
  pq_base_push((PacketQueueBase *)pSVar1[1].request_agent_forwarding,&pPVar2->qnode);
  return;
}

Assistant:

void ssh2channel_request_pty(
    SshChannel *sc, bool want_reply, Conf *conf, int w, int h)
{
    struct ssh2_channel *c = container_of(sc, struct ssh2_channel, sc);
    struct ssh2_connection_state *s = c->connlayer;
    strbuf *modebuf;

    PktOut *pktout = ssh2_chanreq_init(
        c, "pty-req", want_reply ? ssh2_channel_response : NULL, NULL);
    put_stringz(pktout, conf_get_str(conf, CONF_termtype));
    put_uint32(pktout, w);
    put_uint32(pktout, h);
    put_uint32(pktout, 0);             /* pixel width */
    put_uint32(pktout, 0);             /* pixel height */
    modebuf = strbuf_new();
    write_ttymodes_to_packet(
        BinarySink_UPCAST(modebuf), 2,
        get_ttymodes_from_conf(s->ppl.seat, conf));
    put_stringsb(pktout, modebuf);
    pq_push(s->ppl.out_pq, pktout);
}